

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O3

void __thiscall
duckdb::RadixPartitionedHashTable::Finalize
          (RadixPartitionedHashTable *this,ClientContext *context,GlobalSinkState *gstate_p)

{
  unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
  *this_00;
  pointer puVar1;
  pointer puVar2;
  _Head_base<0UL,_duckdb::TupleDataCollection_*,_false> _Var3;
  _Head_base<0UL,_duckdb::AggregatePartition_*,_false> _Var4;
  vector<duckdb::unique_ptr<duckdb::AggregatePartition,std::default_delete<duckdb::AggregatePartition>,true>,std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,std::default_delete<duckdb::AggregatePartition>,true>>>
  *this_01;
  type this_02;
  idx_t iVar5;
  pointer pTVar6;
  idx_t *piVar7;
  ulong uVar8;
  uint64_t uVar9;
  ulong uVar10;
  reference pvVar11;
  pointer pAVar12;
  pointer pTVar13;
  long lVar14;
  size_type __n;
  long lVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  double dVar18;
  _Head_base<0UL,_duckdb::AggregatePartition_*,_false> local_48;
  vector<duckdb::unique_ptr<duckdb::AggregatePartition,std::default_delete<duckdb::AggregatePartition>,true>,std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,std::default_delete<duckdb::AggregatePartition>,true>>>
  *local_40;
  unsafe_vector<unique_ptr<TupleDataCollection>_> *local_38;
  
  if (*(long *)((long)&gstate_p[2].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex +
               8) == 0) {
    gstate_p[3].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__align = 0;
  }
  else {
    this_02 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
              ::operator*((unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
                           *)((long)&gstate_p[2].super_StateWithBlockableTasks.lock.
                                     super___mutex_base._M_mutex + 8));
    iVar5 = PartitionedTupleData::Count(this_02);
    gstate_p[3].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__align = iVar5;
    if (((gstate_p[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size[9] & 1U)
         == 0) &&
       (*(long *)((long)&gstate_p[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex
                 + 0x10) == 1)) {
      bVar16 = gstate_p[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
               __list.__prev == (__pthread_internal_list *)0x1;
    }
    else {
      bVar16 = false;
    }
    local_38 = PartitionedTupleData::GetPartitions(this_02);
    puVar1 = (local_38->
             super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar2 = (local_38->
             super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __n = (long)puVar1 - (long)puVar2 >> 3;
    local_40 = (vector<duckdb::unique_ptr<duckdb::AggregatePartition,std::default_delete<duckdb::AggregatePartition>,true>,std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,std::default_delete<duckdb::AggregatePartition>,true>>>
                *)&gstate_p[2].super_StateWithBlockableTasks.blocked_tasks.
                   super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
                   super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    ::std::
    vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
    ::reserve((vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
               *)local_40,__n);
    if (puVar1 != puVar2) {
      lVar15 = __n + (__n == 0);
      lVar14 = 0;
      do {
        puVar1 = (local_38->
                 super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        this_00 = (unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                   *)((long)&(puVar1->
                             super_unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
                             )._M_t + lVar14);
        pTVar6 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                 ::operator->(this_00);
        iVar5 = TupleDataCollection::SizeInBytes(pTVar6);
        pTVar6 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                 ::operator->(this_00);
        piVar7 = TupleDataCollection::Count(pTVar6);
        uVar8 = *piVar7;
        if (uVar8 < 0x1001) {
          uVar8 = 0x1000;
        }
        auVar17._8_4_ = (int)(uVar8 >> 0x20);
        auVar17._0_8_ = uVar8;
        auVar17._12_4_ = 0x45300000;
        dVar18 = ((auVar17._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0)) * 1.25;
        uVar8 = (ulong)dVar18;
        uVar9 = NextPowerOfTwo((long)(dVar18 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8)
        ;
        uVar10 = uVar9 * 8 + iVar5;
        uVar8 = *(ulong *)((long)&gstate_p[3].super_StateWithBlockableTasks.lock.super___mutex_base.
                                  _M_mutex + 8);
        if (uVar10 < uVar8) {
          uVar10 = uVar8;
        }
        *(ulong *)((long)&gstate_p[3].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex
                  + 8) = uVar10;
        local_48._M_head_impl = (AggregatePartition *)operator_new(0x60);
        _Var3._M_head_impl =
             *(TupleDataCollection **)
              ((long)&(puVar1->
                      super_unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
                      )._M_t + lVar14);
        *(undefined8 *)
         ((long)&(puVar1->
                 super_unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
                 )._M_t + lVar14) = 0;
        ((local_48._M_head_impl)->super_StateWithBlockableTasks).can_block._M_base._M_i = true;
        ((local_48._M_head_impl)->super_StateWithBlockableTasks).lock.super___mutex_base._M_mutex.
        __align = 0;
        *(undefined8 *)
         ((long)&((local_48._M_head_impl)->super_StateWithBlockableTasks).lock.super___mutex_base.
                 _M_mutex + 8) = 0;
        *(undefined8 *)
         ((long)&((local_48._M_head_impl)->super_StateWithBlockableTasks).lock.super___mutex_base.
                 _M_mutex + 0x10) = 0;
        ((local_48._M_head_impl)->super_StateWithBlockableTasks).lock.super___mutex_base._M_mutex.
        __data.__list.__prev = (__pthread_internal_list *)0x0;
        ((local_48._M_head_impl)->super_StateWithBlockableTasks).lock.super___mutex_base._M_mutex.
        __data.__list.__next = (__pthread_internal_list *)0x0;
        ((local_48._M_head_impl)->super_StateWithBlockableTasks).blocked_tasks.
        super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
        super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        ((local_48._M_head_impl)->super_StateWithBlockableTasks).blocked_tasks.
        super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
        super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        ((local_48._M_head_impl)->super_StateWithBlockableTasks).blocked_tasks.
        super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
        super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (local_48._M_head_impl)->state = READY_TO_FINALIZE;
        ((local_48._M_head_impl)->data).
        super_unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::TupleDataCollection_*,_std::default_delete<duckdb::TupleDataCollection>_>
        .super__Head_base<0UL,_duckdb::TupleDataCollection_*,_false>._M_head_impl =
             _Var3._M_head_impl;
        ((local_48._M_head_impl)->progress)._M_i = 0.0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::AggregatePartition,std::default_delete<duckdb::AggregatePartition>,true>,std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,std::default_delete<duckdb::AggregatePartition>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::AggregatePartition,std::default_delete<duckdb::AggregatePartition>,true>>
                  (local_40,(unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>
                             *)&local_48);
        _Var4._M_head_impl = local_48._M_head_impl;
        if (local_48._M_head_impl != (AggregatePartition *)0x0) {
          std::
          unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
          ::~unique_ptr(&((local_48._M_head_impl)->data).
                         super_unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
                       );
          ::std::vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>::~vector
                    (&((_Var4._M_head_impl)->super_StateWithBlockableTasks).blocked_tasks.
                      super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>)
          ;
          operator_delete(_Var4._M_head_impl);
        }
        this_01 = local_40;
        if (bVar16) {
          LOCK();
          gstate_p[3]._vptr_GlobalSinkState =
               (_func_int **)((long)gstate_p[3]._vptr_GlobalSinkState + 1);
          UNLOCK();
          pvVar11 = vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_true>
                    ::back((vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_true>
                            *)local_40);
          pAVar12 = unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>
                    ::operator->(pvVar11);
          LOCK();
          (pAVar12->progress)._M_i = 1.0;
          UNLOCK();
          pvVar11 = vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_true>
                    ::back((vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_true>
                            *)this_01);
          pAVar12 = unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>
                    ::operator->(pvVar11);
          pAVar12->state = READY_TO_SCAN;
        }
        lVar14 = lVar14 + 8;
        lVar15 = lVar15 + -1;
      } while (lVar15 != 0);
    }
  }
  pTVar13 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
            ::operator->((unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
                          *)&gstate_p[1].super_StateWithBlockableTasks);
  TemporaryMemoryState::SetMinimumReservation
            (pTVar13,(idx_t)(&(gstate_p[2].super_StateWithBlockableTasks.blocked_tasks.
                               super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                               .
                               super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                               ._M_impl.super__Vector_impl_data._M_start)->mode +
                            *(long *)((long)&gstate_p[3].super_StateWithBlockableTasks.lock.
                                             super___mutex_base._M_mutex + 8)));
  pTVar13 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
            ::operator->((unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
                          *)&gstate_p[1].super_StateWithBlockableTasks);
  TemporaryMemoryState::SetZero(pTVar13);
  gstate_p[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size[8] = '\x01';
  return;
}

Assistant:

void RadixPartitionedHashTable::Finalize(ClientContext &context, GlobalSinkState &gstate_p) const {
	auto &gstate = gstate_p.Cast<RadixHTGlobalSinkState>();

	if (gstate.uncombined_data) {
		auto &uncombined_data = *gstate.uncombined_data;
		gstate.count_before_combining = uncombined_data.Count();

		// If true there is no need to combine, it was all done by a single thread in a single HT
		const auto single_ht = !gstate.external && gstate.active_threads == 1 && gstate.number_of_threads == 1;

		auto &uncombined_partition_data = uncombined_data.GetPartitions();
		const auto n_partitions = uncombined_partition_data.size();
		gstate.partitions.reserve(n_partitions);
		for (idx_t i = 0; i < n_partitions; i++) {
			auto &partition = uncombined_partition_data[i];
			auto partition_size =
			    partition->SizeInBytes() +
			    GroupedAggregateHashTable::GetCapacityForCount(partition->Count()) * sizeof(ht_entry_t);
			gstate.max_partition_size = MaxValue(gstate.max_partition_size, partition_size);

			gstate.partitions.emplace_back(make_uniq<AggregatePartition>(std::move(partition)));
			if (single_ht) {
				gstate.finalize_done++;
				gstate.partitions.back()->progress = 1;
				gstate.partitions.back()->state = AggregatePartitionState::READY_TO_SCAN;
			}
		}
	} else {
		gstate.count_before_combining = 0;
	}

	// Minimum of combining one partition at a time
	gstate.temporary_memory_state->SetMinimumReservation(gstate.stored_allocators_size + gstate.max_partition_size);
	// Set size to 0 until the scan actually starts
	gstate.temporary_memory_state->SetZero();
	gstate.finalized = true;
}